

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

SummaryColumn * __thiscall
Catch::SummaryColumn::addRow(SummaryColumn *__return_storage_ptr__,SummaryColumn *this,size_t count)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  reference local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *oldRow;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string row;
  undefined1 local_38 [8];
  ReusableStringStream rss;
  size_t count_local;
  SummaryColumn *this_local;
  
  rss.m_oss = (ostream *)count;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_38);
  ReusableStringStream::operator<<((ReusableStringStream *)local_38,(unsigned_long *)&rss.m_oss);
  ReusableStringStream::str_abi_cxx11_((string *)&__range2,(ReusableStringStream *)local_38);
  __end2._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&this->rows);
  oldRow = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&this->rows);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&oldRow), bVar1) {
    local_88 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
    while( true ) {
      uVar2 = std::__cxx11::string::size();
      uVar3 = std::__cxx11::string::size();
      if (uVar3 <= uVar2) break;
      std::operator+(&local_a8,' ',
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      std::__cxx11::string::operator=((string *)local_88,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    while( true ) {
      uVar2 = std::__cxx11::string::size();
      uVar3 = std::__cxx11::string::size();
      if (uVar2 <= uVar3) break;
      std::operator+(&local_c8,' ',
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2)
      ;
      std::__cxx11::string::operator=((string *)&__range2,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->rows,(value_type *)&__range2);
  SummaryColumn(__return_storage_ptr__,this);
  std::__cxx11::string::~string((string *)&__range2);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_38);
  return __return_storage_ptr__;
}

Assistant:

SummaryColumn addRow( std::size_t count ) {
        ReusableStringStream rss;
        rss << count;
        std::string row = rss.str();
        for (auto& oldRow : rows) {
            while (oldRow.size() < row.size())
                oldRow = ' ' + oldRow;
            while (oldRow.size() > row.size())
                row = ' ' + row;
        }
        rows.push_back(row);
        return *this;
    }